

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O3

ssize_t __thiscall serial::Serial::write(Serial *this,int __fd,void *__buf,size_t __n)

{
  SerialImpl *this_00;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  
  this_00 = this->pimpl_;
  SerialImpl::writeLock(this_00);
  sVar1 = SerialImpl::write(this->pimpl_,(int)*(undefined8 *)CONCAT44(in_register_00000034,__fd),
                            (void *)((undefined8 *)CONCAT44(in_register_00000034,__fd))[1],__n);
  SerialImpl::writeUnlock(this_00);
  return sVar1;
}

Assistant:

size_t
Serial::write (const string &data)
{
  ScopedWriteLock lock(this->pimpl_);
  return this->write_ (reinterpret_cast<const uint8_t*>(data.c_str()),
                       data.length());
}